

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

void __thiscall deci::dictionary_t::~dictionary_t(dictionary_t *this)

{
  dictionary_t *this_local;
  
  ~dictionary_t(this);
  operator_delete(this);
  return;
}

Assistant:

dictionary_t::~dictionary_t() {
    for (auto el: this->storage) {
      el.first->Delete();
      el.second->Delete();
    }
  }